

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O0

CURLcode Curl_auth_create_plain_message
                   (Curl_easy *data,char *authzid,char *authcid,char *passwd,char **outptr,
                   size_t *outlen)

{
  size_t __n;
  size_t __n_00;
  size_t insize;
  char *inputbuff;
  size_t local_78;
  size_t plainlen;
  size_t plen;
  size_t clen;
  size_t zlen;
  char *plainauth;
  CURLcode result;
  size_t *outlen_local;
  char **outptr_local;
  char *passwd_local;
  char *authcid_local;
  char *authzid_local;
  Curl_easy *data_local;
  
  *outlen = 0;
  *outptr = (char *)0x0;
  if (authzid == (char *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = strlen(authzid);
  }
  __n = strlen(authcid);
  __n_00 = strlen(passwd);
  if ((local_78 + __n < 0x4000000000000000) && (__n_00 < 0x7ffffffffffffffe)) {
    insize = local_78 + __n + __n_00 + 2;
    inputbuff = (char *)(*Curl_cmalloc)(insize);
    if (inputbuff == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if (local_78 != 0) {
        memcpy(inputbuff,authzid,local_78);
      }
      inputbuff[local_78] = '\0';
      memcpy(inputbuff + local_78 + 1,authcid,__n);
      inputbuff[local_78 + __n + 1] = '\0';
      memcpy(inputbuff + __n + local_78 + 2,passwd,__n_00);
      data_local._4_4_ = Curl_base64_encode(data,inputbuff,insize,outptr,outlen);
      (*Curl_cfree)(inputbuff);
    }
  }
  else {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_plain_message(struct Curl_easy *data,
                                        const char *authzid,
                                        const char *authcid,
                                        const char *passwd,
                                        char **outptr, size_t *outlen)
{
  CURLcode result;
  char *plainauth;
  size_t zlen;
  size_t clen;
  size_t plen;
  size_t plainlen;

  *outlen = 0;
  *outptr = NULL;
  zlen = (authzid == NULL ? 0 : strlen(authzid));
  clen = strlen(authcid);
  plen = strlen(passwd);

  /* Compute binary message length. Check for overflows. */
  if(((zlen + clen) > SIZE_T_MAX/4) || (plen > (SIZE_T_MAX/2 - 2)))
    return CURLE_OUT_OF_MEMORY;
  plainlen = zlen + clen + plen + 2;

  plainauth = malloc(plainlen);
  if(!plainauth)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the reply */
  if(zlen != 0)
    memcpy(plainauth, authzid, zlen);
  plainauth[zlen] = '\0';
  memcpy(plainauth + zlen + 1, authcid, clen);
  plainauth[zlen + clen + 1] = '\0';
  memcpy(plainauth + zlen + clen + 2, passwd, plen);

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, plainauth, plainlen, outptr, outlen);
  free(plainauth);

  return result;
}